

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  uint uVar1;
  VarData *pVVar2;
  uint64_t uVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  vec<Minisat::Watcher> *pvVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches_bin);
  if (0 < (this->vardata).sz) {
    lVar6 = 0;
    do {
      lVar14 = 0;
      do {
        lVar13 = lVar14 + lVar6 * 2;
        pvVar11 = (this->watches).occs.data;
        if (0 < pvVar11[lVar13].sz) {
          pvVar11 = pvVar11 + lVar13;
          lVar12 = 0;
          lVar8 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar11->data->cref + lVar12),to);
            lVar8 = lVar8 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar8 < pvVar11->sz);
        }
        pvVar11 = (this->watches_bin).occs.data;
        if (0 < pvVar11[lVar13].sz) {
          pvVar11 = pvVar11 + lVar13;
          lVar13 = 0;
          lVar8 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar11->data->cref + lVar13),to);
            lVar8 = lVar8 + 1;
            lVar13 = lVar13 + 8;
          } while (lVar8 < pvVar11->sz);
        }
        bVar15 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar15);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->vardata).sz);
  }
  if (0 < (this->trail).sz) {
    lVar6 = 0;
    do {
      pVVar2 = (this->vardata).data;
      iVar5 = (this->trail).data[lVar6].x >> 1;
      uVar1 = pVVar2[iVar5].reason;
      uVar7 = (ulong)uVar1;
      if ((uVar7 != 0xffffffff) &&
         (uVar3 = (this->statistics).solveSteps, (this->statistics).solveSteps = uVar3 + 1,
         uVar3 != 0)) {
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((*(ulong *)(puVar4 + uVar7) & 0x10) == 0) {
          if ((uint)(*(ulong *)(puVar4 + uVar7) >> 0x22) == 2) {
            uVar10 = (ulong)((this->assigns).data[(int)puVar4[uVar7 + 2] >> 1].value !=
                            ((byte)puVar4[uVar7 + 2] & 1));
          }
          else {
            uVar10 = 0;
          }
          iVar9 = (int)puVar4[uVar7 + uVar10 + 2] >> 1;
          if ((((this->assigns).data[iVar9].value != ((byte)puVar4[uVar7 + uVar10 + 2] & 1)) ||
              (pVVar2[iVar9].reason == 0xffffffff)) || (pVVar2[iVar9].reason != uVar1))
          goto LAB_0011c681;
        }
        ClauseAllocator::reloc(&this->ca,&pVVar2[iVar5].reason,to);
      }
LAB_0011c681:
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->trail).sz);
  }
  if (0 < (this->old_trail).sz) {
    lVar6 = 0;
    do {
      puVar4 = (this->oldreasons).data;
      iVar5 = (this->old_trail).data[lVar6].x >> 1;
      uVar7 = (ulong)puVar4[iVar5];
      if ((uVar7 != 0xffffffff) &&
         (((this->ca).super_RegionAllocator<unsigned_int>.memory[uVar7] & 0x10) != 0)) {
        ClauseAllocator::reloc(&this->ca,puVar4 + iVar5,to);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->old_trail).sz);
  }
  if (0 < (this->learnts_core).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_core).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->learnts_core).sz);
  }
  if (0 < (this->learnts_tier2).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_tier2).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->learnts_tier2).sz);
  }
  if (0 < (this->learnts_local).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_local).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->learnts_local).sz);
  }
  iVar5 = (this->clauses).sz;
  if (iVar5 < 1) {
    iVar9 = 0;
  }
  else {
    lVar6 = 0;
    lVar14 = 0;
    iVar9 = 0;
    do {
      puVar4 = (this->clauses).data;
      if (((this->ca).super_RegionAllocator<unsigned_int>.memory[*(uint *)((long)puVar4 + lVar6)] &
          3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar4 + lVar6),to);
        puVar4 = (this->clauses).data;
        lVar13 = (long)iVar9;
        iVar9 = iVar9 + 1;
        puVar4[lVar13] = *(uint *)((long)puVar4 + lVar6);
      }
      lVar14 = lVar14 + 1;
      iVar5 = (this->clauses).sz;
      lVar6 = lVar6 + 4;
    } while (lVar14 < iVar5);
    iVar9 = (int)lVar14 - iVar9;
  }
  if (0 < iVar9) {
    (this->clauses).sz = iVar5 - iVar9;
  }
  if (0 < (this->simplifyBuffer).ring.sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      puVar4 = (this->simplifyBuffer).ring.data;
      if (*(int *)((long)puVar4 + lVar14) != -1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar4 + lVar14),to);
      }
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->simplifyBuffer).ring.sz);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator &to)
{
    TRACE(std::cout << "c relocing ..." << std::endl);

    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watches_bin.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher> &ws = watches[p];
            for (int j = 0; j < ws.size(); j++) ca.reloc(ws[j].cref, to);
            vec<Watcher> &ws_bin = watches_bin[p];
            for (int j = 0; j < ws_bin.size(); j++) ca.reloc(ws_bin[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && statistics.solveSteps++ && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    for (int i = 0; i < old_trail.size(); i++) {
        Var v = var(old_trail[i]);

        if (oldreasons[v] != CRef_Undef && (ca[oldreasons[v]].reloced())) ca.reloc(oldreasons[v], to);
    }

    // All learnt:
    //
    for (int i = 0; i < learnts_core.size(); i++) ca.reloc(learnts_core[i], to);
    for (int i = 0; i < learnts_tier2.size(); i++) ca.reloc(learnts_tier2[i], to);
    for (int i = 0; i < learnts_local.size(); i++) ca.reloc(learnts_local[i], to);

    // All original:
    //
    int i, j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() != 1) {
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);

    for (int i = 0; i < simplifyBuffer.size(); i++) {
        if (simplifyBuffer[i] != CRef_Undef) ca.reloc(simplifyBuffer[i], to);
    }
}